

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  rle16_t *__src;
  uint8_t uVar1;
  rle16_t *prVar2;
  array_container_t *c;
  uint uVar3;
  int32_t iVar4;
  int iVar5;
  undefined4 extraout_var;
  array_container_t *paVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  undefined8 uVar13;
  ulong uVar14;
  ushort ikey;
  int iVar15;
  uint uVar16;
  uint32_t uVar17;
  uint16_t ikey_00;
  uint range_start;
  bool bVar18;
  uint8_t new_type;
  array_container_t *local_70;
  ulong local_68;
  uint32_t local_5c;
  rle16_t *local_58;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  undefined8 local_38;
  
  if (min <= max) {
    local_50 = max >> 0x10;
    iVar12 = local_50 - (min >> 0x10);
    local_5c = min;
    uVar3 = count_greater((r->high_low_container).keys,(r->high_low_container).size,
                          (uint16_t)(max >> 0x10));
    local_40 = (ulong)(min >> 0x10);
    iVar4 = count_less((r->high_low_container).keys,(r->high_low_container).size - uVar3,
                       (uint16_t)(min >> 0x10));
    iVar5 = (r->high_low_container).size;
    iVar15 = (iVar5 - iVar4) - uVar3;
    if (iVar15 <= iVar12) {
      ra_shift_tail(&r->high_low_container,uVar3,(iVar12 - iVar15) + 1);
      iVar5 = (r->high_low_container).size;
    }
    uVar8 = (iVar4 + iVar15) - 1;
    local_44 = (int)local_40 - 1;
    local_5c = local_5c & 0xffff;
    local_48 = max & 0xffff;
    lVar11 = (long)(int)(~uVar3 + iVar5);
    for (uVar3 = local_50; uVar3 != local_44; uVar3 = uVar3 - 1) {
      range_start = 0;
      if ((uint)local_40 == uVar3) {
        range_start = local_5c;
      }
      uVar17 = 0xffff;
      if (local_50 == uVar3) {
        uVar17 = local_48;
      }
      if (((int)uVar8 < 0) || (uVar3 != (r->high_low_container).keys[uVar8])) {
        paVar6 = (array_container_t *)container_range_of_ones(range_start,uVar17 + 1,&new_type);
      }
      else {
        local_68 = (ulong)uVar8;
        local_4c = uVar8;
        ra_unshare_container_at_index(&r->high_low_container,(uint16_t)uVar8);
        paVar6 = (array_container_t *)(r->high_low_container).containers[local_68];
        uVar1 = (r->high_low_container).typecodes[local_68];
        ikey = (ushort)uVar17;
        ikey_00 = (uint16_t)range_start;
        local_70 = paVar6;
        if (uVar1 == '\x03') {
          prVar2 = (rle16_t *)paVar6->array;
          uVar8 = paVar6->cardinality;
          if (uVar8 == 0) {
            lVar7 = 0;
            iVar5 = 0;
            uVar16 = 0;
          }
          else {
            uVar10 = 0;
            uVar16 = uVar8;
            do {
              while( true ) {
                if ((int)uVar16 <= (int)uVar10) {
                  iVar5 = uVar8 - uVar10;
                  if (uVar10 != 0) goto LAB_0010945f;
                  lVar7 = 0;
                  uVar16 = 0;
                  goto LAB_00109513;
                }
                uVar9 = uVar10 + (uVar16 - 1) >> 1;
                if (ikey <= (ushort)(prVar2[uVar9].length + prVar2[uVar9].value)) break;
                uVar10 = uVar9 + 1;
              }
              uVar16 = uVar9;
            } while (uVar17 + 1 < (uint)prVar2[uVar9].value);
            uVar10 = uVar9 + 1;
            iVar5 = ~uVar9 + uVar8;
LAB_0010945f:
            uVar9 = 0;
            uVar14 = (ulong)uVar10;
            do {
              iVar12 = (int)uVar14;
              while( true ) {
                uVar16 = uVar9;
                if (iVar12 <= (int)uVar9) goto LAB_001094c2;
                uVar16 = uVar9 + iVar12 + -1 >> 1;
                uVar14 = (ulong)uVar16;
                if (range_start <= (ushort)(prVar2[uVar14].length + prVar2[uVar14].value) + 1)
                break;
                uVar9 = uVar16 + 1;
              }
            } while (ikey_00 < prVar2[uVar14].value);
LAB_001094c2:
            lVar7 = (long)(int)uVar10;
          }
LAB_00109513:
          iVar12 = uVar16 + iVar5 + 1;
          if (iVar12 * 4 < 0x2001) {
            if (uVar8 == uVar16 + iVar5) {
              makeRoomAtIndex((run_container_t *)paVar6,(uint16_t)uVar16);
              prVar2 = (rle16_t *)local_70->array;
              prVar2[uVar16].value = ikey_00;
              prVar2[uVar16].length = ikey - ikey_00;
            }
            else {
              __src = prVar2 + lVar7;
              uVar8 = (uint)__src[-1].length + (uint)__src[-1].value;
              if (prVar2[uVar16].value < range_start) {
                range_start = (uint)prVar2[uVar16].value;
              }
              if (uVar8 <= uVar17) {
                uVar8 = uVar17;
              }
              prVar2[uVar16].value = (uint16_t)range_start;
              prVar2[uVar16].length = (short)uVar8 - (uint16_t)range_start;
              memmove(prVar2 + (uVar16 + 1),__src,(long)iVar5 << 2);
              local_70->cardinality = iVar12;
            }
            new_type = '\x03';
            paVar6 = local_70;
          }
          else {
            paVar6 = (array_container_t *)
                     container_from_run_range
                               ((run_container_t *)paVar6,range_start,uVar17,&new_type);
          }
        }
        else if (uVar1 == '\x02') {
          iVar4 = count_greater((uint16_t *)paVar6->array,paVar6->cardinality,ikey);
          uVar8 = count_less((uint16_t *)paVar6->array,paVar6->cardinality - iVar4,ikey_00);
          uVar16 = uVar17 - range_start;
          iVar5 = uVar16 + uVar8 + iVar4 + 1;
          if (iVar5 == 0x10000) {
LAB_0010943d:
            new_type = '\x03';
            paVar6 = (array_container_t *)run_container_create_range(0,0x10000);
          }
          else {
            local_58 = (rle16_t *)CONCAT44(local_58._4_4_,iVar5);
            if (iVar5 < 0x1001) {
              new_type = '\x02';
              uVar13 = CONCAT44(extraout_var,iVar4);
              if (local_70->capacity < iVar5) {
                local_38 = CONCAT44(extraout_var,iVar4);
                array_container_grow(local_70,iVar5,true);
                uVar13 = local_38;
              }
              memmove(&((rle16_t *)local_70->array)->value + (int)(uVar16 + uVar8 + 1),
                      (void *)((long)local_70->array +
                              ((long)local_70->cardinality - (long)(int)uVar13) * 2),
                      (long)(int)uVar13 * 2);
              prVar2 = (rle16_t *)local_70->array;
              lVar7 = (ulong)uVar16 + 1;
              while (bVar18 = lVar7 != 0, lVar7 = lVar7 + -1, bVar18) {
                (&prVar2->value)[uVar8] = (uint16_t)range_start;
                uVar8 = uVar8 + 1;
                range_start = range_start + 1;
              }
              local_70->cardinality = (int32_t)local_58;
              paVar6 = local_70;
            }
            else {
              new_type = '\x01';
              paVar6 = (array_container_t *)bitset_container_from_array(local_70);
              bitset_set_lenrange((uint64_t *)paVar6->array,range_start,uVar16);
              paVar6->cardinality = (int32_t)local_58;
            }
          }
        }
        else {
          uVar17 = uVar17 - range_start;
          iVar5 = paVar6->cardinality;
          local_58 = (rle16_t *)paVar6->array;
          iVar12 = bitset_lenrange_cardinality((uint64_t *)local_58,range_start,uVar17);
          iVar5 = ((iVar5 + uVar17) - iVar12) + 1;
          if (iVar5 == 0x10000) goto LAB_0010943d;
          new_type = '\x01';
          bitset_set_lenrange((uint64_t *)local_58,range_start,uVar17);
          local_70->cardinality = iVar5;
          paVar6 = local_70;
        }
        c = (array_container_t *)(r->high_low_container).containers[local_68];
        if (paVar6 != c) {
          container_free(c,(r->high_low_container).typecodes[local_68]);
        }
        uVar8 = local_4c - 1;
      }
      (r->high_low_container).keys[lVar11] = (uint16_t)uVar3;
      (r->high_low_container).containers[lVar11] = paVar6;
      (r->high_low_container).typecodes[lVar11] = new_type;
      lVar11 = lVar11 + -1;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r, uint32_t min,
                                     uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t num_required_containers = max_key - min_key + 1;
    int32_t suffix_length =
        count_greater(ra->keys, ra->size, (uint16_t)max_key);
    int32_t prefix_length =
        count_less(ra->keys, ra->size - suffix_length, (uint16_t)min_key);
    int32_t common_length = ra->size - prefix_length - suffix_length;

    if (num_required_containers > common_length) {
        ra_shift_tail(ra, suffix_length,
                      num_required_containers - common_length);
    }

    int32_t src = prefix_length + common_length - 1;
    int32_t dst = ra->size - suffix_length - 1;
    for (uint32_t key = max_key; key != min_key - 1;
         key--) {  // beware of min_key==0
        uint32_t container_min = (min_key == key) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == key) ? (max & 0xffff) : 0xffff;
        container_t *new_container;
        uint8_t new_type;

        if (src >= 0 && ra->keys[src] == key) {
            ra_unshare_container_at_index(ra, (uint16_t)src);
            new_container =
                container_add_range(ra->containers[src], ra->typecodes[src],
                                    container_min, container_max, &new_type);
            if (new_container != ra->containers[src]) {
                container_free(ra->containers[src], ra->typecodes[src]);
            }
            src--;
        } else {
            new_container = container_from_range(&new_type, container_min,
                                                 container_max + 1, 1);
        }
        ra_replace_key_and_container_at_index(ra, dst, (uint16_t)key,
                                              new_container, new_type);
        dst--;
    }
}